

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covar.cpp
# Opt level: O1

AggregateFunction * duckdb::CovarSampFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  LogicalType *in_R8;
  LogicalType local_50;
  LogicalType local_38;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffe0,DOUBLE);
  LogicalType::LogicalType(&local_38,DOUBLE);
  LogicalType::LogicalType(&local_50,DOUBLE);
  AggregateFunction::
  BinaryAggregate<duckdb::CovarState,double,double,double,duckdb::CovarSampOperation,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffe0,&local_38,&local_50,in_R8);
  LogicalType::~LogicalType(&local_50);
  LogicalType::~LogicalType(&local_38);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffe0);
  return in_RDI;
}

Assistant:

AggregateFunction CovarSampFun::GetFunction() {
	return AggregateFunction::BinaryAggregate<CovarState, double, double, double, CovarSampOperation>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE);
}